

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall mario::TimerQueue::TimerQueue(TimerQueue *this,EventLoop *loop)

{
  int iVar1;
  TimerQueue *local_68;
  code *local_60;
  undefined8 local_58;
  type local_50;
  ReadEventCallback local_38;
  EventLoop *local_18;
  EventLoop *loop_local;
  TimerQueue *this_local;
  
  this->_loop = loop;
  local_18 = loop;
  loop_local = (EventLoop *)this;
  iVar1 = detail::createTimerfd();
  this->_timerfd = iVar1;
  Channel::Channel(&this->_timerfdChannel,local_18,this->_timerfd);
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->_timers)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  set<std::pair<mario::Timestamp,_mario::Timer_*>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  ::set(&this->_timers);
  this->_callingExpiredTimers = false;
  std::
  set<std::pair<mario::Timer_*,_long>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
  ::set(&this->_activeTimers);
  std::
  set<std::pair<mario::Timer_*,_long>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
  ::set(&this->_cancelingTimers);
  local_60 = handleRead;
  local_58 = 0;
  local_68 = this;
  std::bind<void(mario::TimerQueue::*)(),mario::TimerQueue*>
            (&local_50,(offset_in_TimerQueue_to_subr *)&local_60,&local_68);
  std::function<void(mario::Timestamp)>::
  function<std::_Bind<void(mario::TimerQueue::*(mario::TimerQueue*))()>,void>
            ((function<void(mario::Timestamp)> *)&local_38,&local_50);
  Channel::setReadCallback(&this->_timerfdChannel,&local_38);
  std::function<void_(mario::Timestamp)>::~function(&local_38);
  Channel::enableReading(&this->_timerfdChannel);
  return;
}

Assistant:

TimerQueue::TimerQueue(EventLoop* loop)
    : _loop(loop)
    , _timerfd(createTimerfd()) 
    , _timerfdChannel(loop, _timerfd)
    , _timers()
    , _callingExpiredTimers(false)
{
    _timerfdChannel.setReadCallback(
            std::bind(&TimerQueue::handleRead, this)
        );
    _timerfdChannel.enableReading();
}